

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglCreateContextExtTests.cpp
# Opt level: O0

void __thiscall
deqp::egl::anon_unknown_3::CreateContextExtCase::executeForSurface
          (CreateContextExtCase *this,EGLConfig config,EGLSurface surface)

{
  EGLDisplay pvVar1;
  EglTestContext *this_00;
  glWaitSyncFunc p_Var2;
  bool bVar3;
  deUint32 dVar4;
  deBool dVar5;
  ApiType apiType;
  reference pvVar6;
  EGLContext pvVar7;
  Error *error;
  undefined1 local_1a78 [8];
  UniqueContext context;
  undefined1 local_1a50 [8];
  Functions gl;
  Library *egl;
  EGLSurface surface_local;
  EGLConfig config_local;
  CreateContextExtCase *this_local;
  
  gl.waitSync = (glWaitSyncFunc)EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
  do {
    (*(code *)**(undefined8 **)gl.waitSync)(gl.waitSync,this->m_api);
    dVar4 = (**(code **)(*(long *)gl.waitSync + 0xf8))();
    eglu::checkError(dVar4,"bindAPI(m_api)",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglCreateContextExtTests.cpp"
                     ,0x3b7);
    dVar5 = ::deGetFalse();
  } while (dVar5 != 0);
  glw::Functions::Functions((Functions *)local_1a50);
  p_Var2 = gl.waitSync;
  pvVar1 = this->m_display;
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&this->m_attribList,0);
  pvVar7 = (EGLContext)(**(code **)(*(long *)p_Var2 + 0x30))(p_Var2,pvVar1,config,0,pvVar6);
  eglu::UniqueContext::UniqueContext((UniqueContext *)local_1a78,(Library *)p_Var2,pvVar1,pvVar7);
  dVar4 = (**(code **)(*(long *)gl.waitSync + 0xf8))();
  eglu::checkError(dVar4,"eglCreateContext",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglCreateContextExtTests.cpp"
                   ,0x3bd);
  do {
    p_Var2 = gl.waitSync;
    pvVar1 = this->m_display;
    pvVar7 = eglu::UniqueContext::operator*((UniqueContext *)local_1a78);
    (**(code **)(*(long *)p_Var2 + 0x138))(p_Var2,pvVar1,surface,surface,pvVar7);
    dVar4 = (**(code **)(*(long *)gl.waitSync + 0xf8))();
    eglu::checkError(dVar4,"makeCurrent(m_display, surface, surface, *context)",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglCreateContextExtTests.cpp"
                     ,0x3bf);
    dVar5 = ::deGetFalse();
  } while (dVar5 != 0);
  this_00 = (this->super_TestCase).m_eglTestCtx;
  apiType = glu::ContextType::getAPI(&this->m_glContextType);
  EglTestContext::initGLFunctions(this_00,(Functions *)local_1a50,apiType);
  bVar3 = validateCurrentContext(this,(Functions *)local_1a50);
  if (!bVar3) {
    this->m_isOk = false;
  }
  eglu::UniqueContext::~UniqueContext((UniqueContext *)local_1a78);
  do {
    (**(code **)(*(long *)gl.waitSync + 0x138))(gl.waitSync,this->m_display,0,0);
    dVar4 = (**(code **)(*(long *)gl.waitSync + 0xf8))();
    eglu::checkError(dVar4,"makeCurrent(m_display, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT)",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglCreateContextExtTests.cpp"
                     ,0x3d3);
    dVar5 = ::deGetFalse();
  } while (dVar5 != 0);
  return;
}

Assistant:

void CreateContextExtCase::executeForSurface (EGLConfig config, EGLSurface surface)
{
	const Library&	egl		= m_eglTestCtx.getLibrary();

	EGLU_CHECK_CALL(egl, bindAPI(m_api));

	try
	{
		glw::Functions		gl;
		eglu::UniqueContext	context	(egl, m_display, egl.createContext(m_display, config, EGL_NO_CONTEXT, &m_attribList[0]));
		EGLU_CHECK_MSG(egl, "eglCreateContext");

		EGLU_CHECK_CALL(egl, makeCurrent(m_display, surface, surface, *context));

		m_eglTestCtx.initGLFunctions(&gl, m_glContextType.getAPI());

		if (!validateCurrentContext(gl))
			m_isOk = false;
	}
	catch (const eglu::Error& error)
	{
		if (error.getError() == EGL_BAD_MATCH)
			m_testCtx.getLog() << TestLog::Message << "Context creation failed with error EGL_BAD_CONTEXT. Config doesn't support api version." << TestLog::EndMessage;
		else if (error.getError() == EGL_BAD_CONFIG)
			m_testCtx.getLog() << TestLog::Message << "Context creation failed with error EGL_BAD_MATCH. Context attribute compination not supported." << TestLog::EndMessage;
		else
		{
			m_testCtx.getLog() << TestLog::Message << "Context creation failed with error " << eglu::getErrorStr(error.getError()) << ". Error is not result of unsupported api etc." << TestLog::EndMessage;
			m_isOk = false;
		}
	}

	EGLU_CHECK_CALL(egl, makeCurrent(m_display, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT));
}